

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection_impl.hpp
# Opt level: O2

void __thiscall
websocketpp::connection<websocketpp::config::asio>::log_http_result
          (connection<websocketpp::config::asio> *this)

{
  request_type *r;
  size_type sVar1;
  element_type *peVar2;
  basic<websocketpp::concurrency::basic,_websocketpp::log::alevel> *this_00;
  bool bVar3;
  string *psVar4;
  ostream *poVar5;
  string *in_RCX;
  string ua;
  stringstream s;
  allocator local_27c;
  allocator local_27b;
  allocator local_27a;
  allocator local_279;
  string local_278;
  string local_258 [8];
  long local_250;
  string local_238;
  string local_218;
  string local_1f8;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  r = &this->m_request;
  bVar3 = processor::is_websocket_handshake<websocketpp::http::parser::request>(r);
  if (bVar3) {
    log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>::write
              ((this->m_alog).
               super___shared_ptr<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr,0x400,"Call to log_http_result for WebSocket",(size_t)in_RCX);
  }
  else {
    std::__cxx11::string::string((string *)&local_278,"host",&local_27c);
    psVar4 = http::parser::parser::get_header(&r->super_parser,&local_278);
    sVar1 = psVar4->_M_string_length;
    if (sVar1 == 0) {
      std::__cxx11::string::string(local_258,"-",(allocator *)&local_1f8);
    }
    else {
      std::__cxx11::string::string((string *)&local_1f8,"host",&local_279);
      psVar4 = http::parser::parser::get_header(&r->super_parser,&local_1f8);
      std::__cxx11::string::string(local_258,(string *)psVar4);
    }
    poVar5 = std::operator<<(local_1a8,local_258);
    poVar5 = std::operator<<(poVar5," ");
    transport::asio::connection<websocketpp::config::asio::transport_config>::
    get_remote_endpoint_abi_cxx11_(&local_218,&this->super_transport_con_type);
    poVar5 = std::operator<<(poVar5,(string *)&local_218);
    poVar5 = std::operator<<(poVar5," \"");
    poVar5 = std::operator<<(poVar5,(string *)&(this->m_request).m_method);
    poVar5 = std::operator<<(poVar5," ");
    peVar2 = (this->m_uri).super___shared_ptr<websocketpp::uri,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar2 == (element_type *)0x0) {
      std::__cxx11::string::string((string *)&local_238,"-",&local_27a);
    }
    else {
      std::__cxx11::string::string((string *)&local_238,(string *)&peVar2->m_resource);
    }
    poVar5 = std::operator<<(poVar5,(string *)&local_238);
    poVar5 = std::operator<<(poVar5," ");
    poVar5 = std::operator<<(poVar5,(string *)r);
    poVar5 = std::operator<<(poVar5,"\" ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,(this->m_response).m_status_code);
    poVar5 = std::operator<<(poVar5," ");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    std::__cxx11::string::~string((string *)&local_238);
    std::__cxx11::string::~string((string *)&local_218);
    std::__cxx11::string::~string(local_258);
    if (sVar1 != 0) {
      std::__cxx11::string::~string((string *)&local_1f8);
    }
    std::__cxx11::string::~string((string *)&local_278);
    std::__cxx11::string::string((string *)&local_278,"User-Agent",(allocator *)&local_218);
    psVar4 = http::parser::parser::get_header(&r->super_parser,&local_278);
    std::__cxx11::string::string(local_258,(string *)psVar4);
    std::__cxx11::string::~string((string *)&local_278);
    if (local_250 == 0) {
      std::operator<<(local_1a8," \"\" ");
    }
    else {
      poVar5 = std::operator<<(local_1a8," \"");
      std::__cxx11::string::string((string *)&local_1d8,local_258);
      std::__cxx11::string::string((string *)&local_218,"\"",&local_27c);
      std::__cxx11::string::string((string *)&local_238,"\\\"",&local_27b);
      in_RCX = &local_238;
      utility::string_replace_all(&local_278,&local_1d8,&local_218,in_RCX);
      poVar5 = std::operator<<(poVar5,(string *)&local_278);
      std::operator<<(poVar5,"\" ");
      std::__cxx11::string::~string((string *)&local_278);
      std::__cxx11::string::~string((string *)&local_238);
      std::__cxx11::string::~string((string *)&local_218);
      std::__cxx11::string::~string((string *)&local_1d8);
    }
    this_00 = (this->m_alog).
              super___shared_ptr<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    std::__cxx11::stringbuf::str();
    log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>::write
              (this_00,0x1000,&local_278,(size_t)in_RCX);
    std::__cxx11::string::~string((string *)&local_278);
    std::__cxx11::string::~string(local_258);
  }
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return;
}

Assistant:

void connection<config>::log_http_result() {
    std::stringstream s;

    if (processor::is_websocket_handshake(m_request)) {
        m_alog->write(log::alevel::devel,"Call to log_http_result for WebSocket");
        return;
    }  

    // Connection Type
    s << (m_request.get_header("host").empty() ? "-" : m_request.get_header("host"))
      << " " << transport_con_type::get_remote_endpoint()
      << " \"" << m_request.get_method() 
      << " " << (m_uri ? m_uri->get_resource() : "-") 
      << " " << m_request.get_version() << "\" " << m_response.get_status_code()
      << " " << m_response.get_body().size();
    
    // User Agent
    std::string ua = m_request.get_header("User-Agent");
    if (ua.empty()) {
        s << " \"\" ";
    } else {
        // check if there are any quotes in the user agent
        s << " \"" << utility::string_replace_all(ua,"\"","\\\"") << "\" ";
    }

    m_alog->write(log::alevel::http,s.str());
}